

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_integer_set_conversion(parser_info *info)

{
  int iVar1;
  int iVar2;
  
  iVar1 = coda_type_number_set_conversion
                    ((coda_type_number *)info->node->parent->data,
                     (coda_conversion *)info->node->data);
  iVar2 = -1;
  if (iVar1 == 0) {
    info->node->data = (void *)0x0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int cd_integer_set_conversion(parser_info *info)
{
    if (coda_type_number_set_conversion((coda_type_number *)info->node->parent->data,
                                        (coda_conversion *)info->node->data) != 0)
    {
        return -1;
    }
    info->node->data = NULL;
    return 0;
}